

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

int32_t uchar_swapNames_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                          UErrorCode *pErrorCode)

{
  uint32_t *__src;
  char cVar1;
  UDataSwapFn *pUVar2;
  uint16_t uVar3;
  int16_t iVar4;
  uint16_t tokenCount;
  int32_t iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  void *__dest;
  void *pvVar11;
  void *pvVar12;
  byte *s;
  byte *pbVar13;
  uint16_t *puVar14;
  size_t sVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  int32_t iVar20;
  byte *pbVar21;
  ulong uVar22;
  int iVar23;
  byte bVar24;
  int iVar25;
  char *pcVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  uint16_t lengths [33];
  uint16_t offsets [33];
  uint8_t trailMap [256];
  uint8_t map [256];
  int16_t tokens [512];
  uint local_740;
  uint16_t local_6d8 [31];
  ushort local_69a;
  uint16_t local_688 [31];
  ushort local_64a;
  byte local_638 [256];
  byte local_538 [256];
  int16_t local_438 [256];
  int16_t local_238 [260];
  
  iVar5 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  bVar24 = *(byte *)((long)inData + 0xd);
  if ((((bVar24 != 0x6e || *(byte *)((long)inData + 0xc) != 0x75) ||
       (bVar24 = 0x6e, *(char *)((long)inData + 0xe) != 'a')) ||
      (*(char *)((long)inData + 0xf) != 'm')) || (*(char *)((long)inData + 0x10) != '\x01')) {
    udata_printError_63(ds,
                        "uchar_swapNames(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unames.icu\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar24,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10));
LAB_002f0736:
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  lVar27 = (long)iVar5;
  __src = (uint32_t *)((long)inData + lVar27);
  if (length < 0) {
    uVar7 = (*ds->readUInt32)(__src[3]);
    uVar6 = (*ds->readUInt32)(*(uint32_t *)((long)__src + (ulong)uVar7));
    uVar10 = uVar7 + 4;
    for (; uVar6 != 0; uVar6 = uVar6 - 1) {
      uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)__src + (ulong)uVar10 + 10));
      uVar10 = uVar10 + uVar3;
    }
    goto LAB_002f0787;
  }
  uVar29 = length - iVar5;
  if (((int)uVar29 < 0x14) || (uVar6 = (*ds->readUInt32)(__src[3]), uVar29 < uVar6)) {
    udata_printError_63(ds,"uchar_swapNames(): too few bytes (%d after header) for unames.icu\n",
                        (ulong)uVar29);
LAB_002f0700:
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    return 0;
  }
  __dest = (void *)((long)outData + lVar27);
  if (inData != outData) {
    memcpy(__dest,__src,(ulong)uVar29);
  }
  uVar7 = (*ds->readUInt32)(*__src);
  uVar8 = (*ds->readUInt32)(__src[1]);
  uVar9 = (*ds->readUInt32)(__src[2]);
  (*ds->swapArray32)(ds,__src,0x10,__dest,pErrorCode);
  uVar3 = (*ds->readUInt16)((uint16_t)__src[4]);
  (*ds->swapArray16)(ds,__src + 4,2,(void *)((long)__dest + 0x10),pErrorCode);
  pvVar12 = (void *)((long)__src + 0x12);
  uVar18 = 0x200;
  if (uVar3 < 0x201) {
    uVar18 = (ulong)uVar3;
  }
  uVar10 = (uint)uVar18;
  if (uVar10 == 0) {
    uVar10 = 0;
LAB_002f0891:
    memset((void *)((long)local_438 + (ulong)(uVar10 * 2)),0,(ulong)(uVar10 * -2 + 0x400));
  }
  else {
    uVar28 = 0;
    do {
      iVar4 = udata_readInt16_63(ds,*(int16_t *)((long)pvVar12 + uVar28 * 2));
      local_438[uVar28] = iVar4;
      uVar28 = uVar28 + 1;
    } while (uVar18 != uVar28);
    if (uVar10 < 0x200) goto LAB_002f0891;
  }
  uVar10 = (uint)uVar3;
  makeTokenMap(ds,local_438,uVar3,local_538,pErrorCode);
  tokenCount = uVar3 - 0x100;
  if (uVar3 < 0x100) {
    tokenCount = 0;
  }
  makeTokenMap(ds,local_238,tokenCount,local_638,pErrorCode);
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  pvVar11 = uprv_malloc_63((ulong)(uVar10 * 2));
  if (pvVar11 == (void *)0x0) {
    udata_printError_63(ds,"out of memory swapping %u unames.icu tokens\n",(ulong)uVar3);
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    return 0;
  }
  uVar17 = 0x100;
  if (uVar10 < 0x100) {
    uVar17 = uVar10;
  }
  if (uVar3 == 0) {
    uVar17 = 0;
  }
  else {
    uVar18 = 0;
    do {
      (*ds->swapArray16)(ds,pvVar12,2,(void *)((long)pvVar11 + (ulong)local_538[uVar18] * 2),
                         pErrorCode);
      uVar18 = uVar18 + 1;
      pvVar12 = (void *)((long)pvVar12 + 2);
    } while (uVar17 != uVar18);
  }
  if (uVar17 < uVar3) {
    uVar18 = (ulong)uVar17;
    pvVar12 = (void *)((long)inData + lVar27 + uVar18 * 2 + 0x12);
    do {
      (*ds->swapArray16)(ds,pvVar12,2,
                         (void *)((long)pvVar11 +
                                 (ulong)local_638[uVar18 & 0xff] * 2 +
                                 (ulong)((uint)uVar18 & 0x7fffff00) * 2),pErrorCode);
      uVar18 = uVar18 + 1;
      pvVar12 = (void *)((long)pvVar12 + 2);
    } while (uVar3 != uVar18);
  }
  memcpy((void *)((long)__dest + 0x12),pvVar11,(ulong)(uVar10 * 2));
  uprv_free_63(pvVar11);
  udata_swapInvStringBlock_63
            (ds,(void *)((ulong)uVar7 + (long)__src),uVar8 - uVar7,
             (void *)((ulong)uVar7 + (long)__dest),pErrorCode);
  if (U_ZERO_ERROR < *pErrorCode) {
    udata_printError_63(ds,"uchar_swapNames(token strings) failed\n");
    return 0;
  }
  uVar18 = (ulong)uVar8;
  uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)__src + uVar18));
  (*ds->swapArray16)(ds,(void *)(uVar18 + (long)__src),((uint)uVar3 + (uint)uVar3 * 2) * 2 + 2,
                     (void *)(uVar18 + (long)__dest),pErrorCode);
  if ((ds->inCharset != ds->outCharset) && (local_740 = uVar6 - uVar9, 0x20 < local_740)) {
    pbVar21 = (byte *)((long)__dest + (ulong)uVar9);
    s = (byte *)((ulong)uVar9 + (long)__src);
    do {
      pbVar13 = icu_63::expandGroupLengths(s,local_688,local_6d8);
      lVar19 = (long)pbVar13 - (long)s;
      pbVar21 = pbVar21 + lVar19;
      s = pbVar13;
      for (iVar23 = (uint)local_69a + (uint)local_64a; iVar23 != 0; iVar23 = iVar23 + iVar25) {
        bVar24 = *s;
        *pbVar21 = local_538[bVar24];
        if (local_438[bVar24] == -2) {
          pbVar13 = s + 1;
          s = s + 2;
          pbVar21[1] = local_638[*pbVar13];
          pbVar21 = pbVar21 + 2;
          iVar25 = -2;
        }
        else {
          s = s + 1;
          pbVar21 = pbVar21 + 1;
          iVar25 = -1;
        }
      }
      local_740 = local_740 - ((uint)local_69a + (uint)local_64a + (int)lVar19);
    } while (0x20 < local_740);
  }
  uVar18 = (ulong)uVar6;
  uVar7 = (*ds->readUInt32)(*(uint32_t *)((long)__src + uVar18));
  (*ds->swapArray32)(ds,(void *)((long)__src + uVar18),4,(void *)(uVar18 + (long)__dest),pErrorCode)
  ;
  uVar10 = uVar6 + 4;
  if (uVar7 != 0) {
    uVar18 = 0;
    do {
      if (uVar29 < uVar10) {
        udata_printError_63(ds,
                            "uchar_swapNames(): too few bytes (%d after header) for unames.icu algorithmic range %u\n"
                            ,(ulong)uVar29,uVar18);
        goto LAB_002f0700;
      }
      uVar28 = (ulong)uVar10;
      pvVar12 = (void *)((long)__src + uVar28);
      pvVar11 = (void *)((long)__dest + uVar28);
      puVar14 = (uint16_t *)((long)__src + uVar28 + 10);
      uVar3 = (*ds->readUInt16)(*puVar14);
      (*ds->swapArray32)(ds,pvVar12,8,pvVar11,pErrorCode);
      (*ds->swapArray16)(ds,puVar14,2,(void *)((long)__dest + uVar28 + 10),pErrorCode);
      bVar24 = *(byte *)((long)__src + uVar28 + 8);
      if (bVar24 == 1) {
        bVar24 = *(byte *)((long)pvVar12 + 9);
        uVar17 = (uint)bVar24 * 2;
        uVar22 = (ulong)uVar17;
        (*ds->swapArray16)(ds,(void *)((long)pvVar12 + 0xc),uVar17,(void *)((long)pvVar11 + 0xc),
                           pErrorCode);
        iVar23 = (uint)uVar3 + (uint)bVar24 * -2;
        uVar16 = (ulong)(iVar23 - 0xc);
        pcVar26 = (char *)((long)inData + uVar16 + uVar28 + uVar22 + lVar27 + 0xb);
        uVar28 = 0;
        do {
          if (uVar16 == uVar28) {
            iVar20 = 0;
            goto LAB_002f0d38;
          }
          uVar28 = uVar28 + 1;
          cVar1 = *pcVar26;
          pcVar26 = pcVar26 + -1;
        } while (cVar1 != '\0');
        iVar20 = (iVar23 - (int)uVar28) + -0xb;
LAB_002f0d38:
        (*ds->swapInvChars)(ds,(void *)((long)pvVar12 + uVar22 + 0xc),iVar20,
                            (void *)((long)pvVar11 + uVar22 + 0xc),pErrorCode);
      }
      else {
        if (bVar24 != 0) {
          udata_printError_63(ds,"uchar_swapNames(): unknown type %u of algorithmic range %u\n",
                              (ulong)bVar24,uVar18);
          goto LAB_002f0736;
        }
        pUVar2 = ds->swapInvChars;
        sVar15 = strlen((char *)((long)pvVar12 + 0xc));
        (*pUVar2)(ds,(char *)((long)pvVar12 + 0xc),(int32_t)sVar15,(void *)((long)pvVar11 + 0xc),
                  pErrorCode);
        if (U_ZERO_ERROR < *pErrorCode) {
          udata_printError_63(ds,"uchar_swapNames(prefix string of algorithmic range %u) failed\n",
                              uVar18);
          return 0;
        }
      }
      uVar10 = uVar10 + uVar3;
      uVar17 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar17;
    } while (uVar17 != uVar7);
  }
LAB_002f0787:
  return uVar10 + iVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uchar_swapNames(const UDataSwapper *ds,
                const void *inData, int32_t length, void *outData,
                UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    uint32_t tokenStringOffset, groupsOffset, groupStringOffset, algNamesOffset,
             offset, i, count, stringsCount;

    const AlgorithmicRange *inRange;
    AlgorithmicRange *outRange;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x75 &&   /* dataFormat="unam" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x61 &&
        pInfo->dataFormat[3]==0x6d &&
        pInfo->formatVersion[0]==1
    )) {
        udata_printError(ds, "uchar_swapNames(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unames.icu\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;
    if(length<0) {
        algNamesOffset=ds->readUInt32(((const uint32_t *)inBytes)[3]);
    } else {
        length-=headerSize;
        if( length<20 ||
            (uint32_t)length<(algNamesOffset=ds->readUInt32(((const uint32_t *)inBytes)[3]))
        ) {
            udata_printError(ds, "uchar_swapNames(): too few bytes (%d after header) for unames.icu\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    if(length<0) {
        /* preflighting: iterate through algorithmic ranges */
        offset=algNamesOffset;
        count=ds->readUInt32(*((const uint32_t *)(inBytes+offset)));
        offset+=4;

        for(i=0; i<count; ++i) {
            inRange=(const AlgorithmicRange *)(inBytes+offset);
            offset+=ds->readUInt16(inRange->size);
        }
    } else {
        /* swap data */
        const uint16_t *p;
        uint16_t *q, *temp;

        int16_t tokens[512];
        uint16_t tokenCount;

        uint8_t map[256], trailMap[256];

        /* copy the data for inaccessible bytes */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, length);
        }

        /* the initial 4 offsets first */
        tokenStringOffset=ds->readUInt32(((const uint32_t *)inBytes)[0]);
        groupsOffset=ds->readUInt32(((const uint32_t *)inBytes)[1]);
        groupStringOffset=ds->readUInt32(((const uint32_t *)inBytes)[2]);
        ds->swapArray32(ds, inBytes, 16, outBytes, pErrorCode);

        /*
         * now the tokens table
         * it needs to be permutated along with the compressed name strings
         */
        p=(const uint16_t *)(inBytes+16);
        q=(uint16_t *)(outBytes+16);

        /* read and swap the tokenCount */
        tokenCount=ds->readUInt16(*p);
        ds->swapArray16(ds, p, 2, q, pErrorCode);
        ++p;
        ++q;

        /* read the first 512 tokens and make the token maps */
        if(tokenCount<=512) {
            count=tokenCount;
        } else {
            count=512;
        }
        for(i=0; i<count; ++i) {
            tokens[i]=udata_readInt16(ds, p[i]);
        }
        for(; i<512; ++i) {
            tokens[i]=0; /* fill the rest of the tokens array if tokenCount<512 */
        }
        makeTokenMap(ds, tokens, tokenCount, map, pErrorCode);
        makeTokenMap(ds, tokens+256, (uint16_t)(tokenCount>256 ? tokenCount-256 : 0), trailMap, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            return 0;
        }

        /*
         * swap and permutate the tokens
         * go through a temporary array to support in-place swapping
         */
        temp=(uint16_t *)uprv_malloc(tokenCount*2);
        if(temp==NULL) {
            udata_printError(ds, "out of memory swapping %u unames.icu tokens\n",
                             tokenCount);
            *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }

        /* swap and permutate single-/lead-byte tokens */
        for(i=0; i<tokenCount && i<256; ++i) {
            ds->swapArray16(ds, p+i, 2, temp+map[i], pErrorCode);
        }

        /* swap and permutate trail-byte tokens */
        for(; i<tokenCount; ++i) {
            ds->swapArray16(ds, p+i, 2, temp+(i&0xffffff00)+trailMap[i&0xff], pErrorCode);
        }

        /* copy the result into the output and free the temporary array */
        uprv_memcpy(q, temp, tokenCount*2);
        uprv_free(temp);

        /*
         * swap the token strings but not a possible padding byte after
         * the terminating NUL of the last string
         */
        udata_swapInvStringBlock(ds, inBytes+tokenStringOffset, (int32_t)(groupsOffset-tokenStringOffset),
                                    outBytes+tokenStringOffset, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "uchar_swapNames(token strings) failed\n");
            return 0;
        }

        /* swap the group table */
        count=ds->readUInt16(*((const uint16_t *)(inBytes+groupsOffset)));
        ds->swapArray16(ds, inBytes+groupsOffset, (int32_t)((1+count*3)*2),
                           outBytes+groupsOffset, pErrorCode);

        /*
         * swap the group strings
         * swap the string bytes but not the nibble-encoded string lengths
         */
        if(ds->inCharset!=ds->outCharset) {
            uint16_t offsets[LINES_PER_GROUP+1], lengths[LINES_PER_GROUP+1];

            const uint8_t *inStrings, *nextInStrings;
            uint8_t *outStrings;

            uint8_t c;

            inStrings=inBytes+groupStringOffset;
            outStrings=outBytes+groupStringOffset;

            stringsCount=algNamesOffset-groupStringOffset;

            /* iterate through string groups until only a few padding bytes are left */
            while(stringsCount>32) {
                nextInStrings=expandGroupLengths(inStrings, offsets, lengths);

                /* move past the length bytes */
                stringsCount-=(uint32_t)(nextInStrings-inStrings);
                outStrings+=nextInStrings-inStrings;
                inStrings=nextInStrings;

                count=offsets[31]+lengths[31]; /* total number of string bytes in this group */
                stringsCount-=count;

                /* swap the string bytes using map[] and trailMap[] */
                while(count>0) {
                    c=*inStrings++;
                    *outStrings++=map[c];
                    if(tokens[c]!=-2) {
                        --count;
                    } else {
                        /* token lead byte: swap the trail byte, too */
                        *outStrings++=trailMap[*inStrings++];
                        count-=2;
                    }
                }
            }
        }

        /* swap the algorithmic ranges */
        offset=algNamesOffset;
        count=ds->readUInt32(*((const uint32_t *)(inBytes+offset)));
        ds->swapArray32(ds, inBytes+offset, 4, outBytes+offset, pErrorCode);
        offset+=4;

        for(i=0; i<count; ++i) {
            if(offset>(uint32_t)length) {
                udata_printError(ds, "uchar_swapNames(): too few bytes (%d after header) for unames.icu algorithmic range %u\n",
                                 length, i);
                *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }

            inRange=(const AlgorithmicRange *)(inBytes+offset);
            outRange=(AlgorithmicRange *)(outBytes+offset);
            offset+=ds->readUInt16(inRange->size);

            ds->swapArray32(ds, inRange, 8, outRange, pErrorCode);
            ds->swapArray16(ds, &inRange->size, 2, &outRange->size, pErrorCode);
            switch(inRange->type) {
            case 0:
                /* swap prefix string */
                ds->swapInvChars(ds, inRange+1, (int32_t)uprv_strlen((const char *)(inRange+1)),
                                    outRange+1, pErrorCode);
                if(U_FAILURE(*pErrorCode)) {
                    udata_printError(ds, "uchar_swapNames(prefix string of algorithmic range %u) failed\n",
                                     i);
                    return 0;
                }
                break;
            case 1:
                {
                    /* swap factors and the prefix and factor strings */
                    uint32_t factorsCount;

                    factorsCount=inRange->variant;
                    p=(const uint16_t *)(inRange+1);
                    q=(uint16_t *)(outRange+1);
                    ds->swapArray16(ds, p, (int32_t)(factorsCount*2), q, pErrorCode);

                    /* swap the strings, up to the last terminating NUL */
                    p+=factorsCount;
                    q+=factorsCount;
                    stringsCount=(uint32_t)((inBytes+offset)-(const uint8_t *)p);
                    while(stringsCount>0 && ((const uint8_t *)p)[stringsCount-1]!=0) {
                        --stringsCount;
                    }
                    ds->swapInvChars(ds, p, (int32_t)stringsCount, q, pErrorCode);
                }
                break;
            default:
                udata_printError(ds, "uchar_swapNames(): unknown type %u of algorithmic range %u\n",
                                 inRange->type, i);
                *pErrorCode=U_UNSUPPORTED_ERROR;
                return 0;
            }
        }
    }

    return headerSize+(int32_t)offset;
}